

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void rankValueFunc(sqlite3_context *pCtx)

{
  i64 *piVar1;
  
  piVar1 = (i64 *)sqlite3_aggregate_context(pCtx,0x18);
  if (piVar1 != (i64 *)0x0) {
    sqlite3_result_int64(pCtx,*piVar1);
    *piVar1 = 0;
  }
  return;
}

Assistant:

static void rankValueFunc(sqlite3_context *pCtx){
  struct CallCount *p;
  p = (struct CallCount*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    sqlite3_result_int64(pCtx, p->nValue);
    p->nValue = 0;
  }
}